

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_thread_waiter.c
# Opt level: O0

void do_once(nsync_atomic_uint32_ *ponce,_func_void_void_ptr *dest)

{
  nsync_atomic_uint32_ nVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t local_1c;
  uint32_t o;
  _func_void_void_ptr *dest_local;
  nsync_atomic_uint32_ *ponce_local;
  
  local_1c = atm_load_acq_u32_(ponce);
  if (local_1c != 2) {
    while( true ) {
      bVar2 = false;
      if (local_1c == 0) {
        LOCK();
        nVar1 = *ponce;
        if (nVar1 == 0) {
          *ponce = 1;
        }
        UNLOCK();
        bVar2 = nVar1 != 0;
      }
      if (!bVar2) break;
      local_1c = *ponce;
    }
    if (local_1c == 0) {
      pthread_key_create(&waiter_key,(__destr_function *)dest);
      *ponce = 2;
    }
    while (uVar3 = atm_load_acq_u32_(ponce), uVar3 != 2) {
      sched_yield();
    }
  }
  return;
}

Assistant:

static void do_once (nsync_atomic_uint32_ *ponce, void (*dest) (void *)) {
	uint32_t o = ATM_LOAD_ACQ (ponce);
	if (o != 2) {
		while (o == 0 && !ATM_CAS_ACQ (ponce, 0, 1)) {
			o = ATM_LOAD (ponce);
		}
		if (o == 0) {
			pthread_key_create (&waiter_key, dest);
			ATM_STORE_REL (ponce, 2);
		}
		while (ATM_LOAD_ACQ (ponce) != 2) {
			sched_yield ();
		}
	}
}